

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_norm_infinity_block
               (Integer g_a,void *ptr,Integer *lo,Integer *hi,Integer ld,Integer type,Integer ndim,
               Integer *dims,void *buf)

{
  double dVar1;
  long *in_RCX;
  long *in_RDX;
  double *in_RSI;
  long in_R8;
  undefined8 in_R9;
  float fVar2;
  double dVar3;
  long in_stack_00000008;
  double *in_stack_00000018;
  Integer in_stack_00000068;
  char *in_stack_00000070;
  SingleComplex *csum;
  DoubleComplex *zsum;
  float *fsum;
  double *dsum;
  long *lsum;
  int *isum;
  Integer j;
  Integer i;
  Integer jhiA;
  Integer jloA;
  Integer ihiA;
  Integer iloA;
  double local_138;
  double local_130;
  float local_128;
  float local_124;
  double local_120;
  double local_118;
  double local_110;
  float local_104;
  float local_100;
  float local_fc;
  float local_d8;
  float fStack_d4;
  double *local_90;
  double *local_88;
  double *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_68 = (double *)0x0;
  local_70 = (double *)0x0;
  local_78 = (double *)0x0;
  local_80 = (double *)0x0;
  local_88 = (double *)0x0;
  local_90 = (double *)0x0;
  switch(in_R9) {
  case 0x3e9:
    local_68 = in_stack_00000018;
    break;
  case 0x3ea:
    local_70 = in_stack_00000018;
    break;
  case 0x3eb:
    local_80 = in_stack_00000018;
    break;
  case 0x3ec:
    local_78 = in_stack_00000018;
    break;
  default:
    pnga_error(in_stack_00000070,in_stack_00000068);
    break;
  case 0x3ee:
    local_90 = in_stack_00000018;
    break;
  case 0x3ef:
    local_88 = in_stack_00000018;
  }
  if (in_stack_00000008 < 1) {
    pnga_error(in_stack_00000070,in_stack_00000068);
  }
  else if (in_stack_00000008 == 1) {
    local_38 = *in_RDX;
    local_40 = *in_RCX;
    local_48 = 1;
    local_50 = 1;
  }
  else if (in_stack_00000008 == 2) {
    local_38 = *in_RDX;
    local_40 = *in_RCX;
    local_48 = in_RDX[1];
    local_50 = in_RCX[1];
  }
  else {
    pnga_error(in_stack_00000070,in_stack_00000068);
  }
  if ((0 < local_40) && (0 < local_50)) {
    switch(in_R9) {
    case 0x3e9:
      if ((int)*(float *)in_RSI < 0) {
        local_fc = (float)-(int)*(float *)in_RSI;
      }
      else {
        local_fc = *(float *)in_RSI;
      }
      *(float *)local_68 = local_fc;
      for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
        for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
          if ((int)*(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4) < 0) {
            local_100 = (float)-(int)*(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4);
          }
          else {
            local_100 = *(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4);
          }
          if ((int)*(float *)local_68 < (int)local_100) {
            if ((int)*(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4) < 0) {
              local_104 = (float)-(int)*(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4);
            }
            else {
              local_104 = *(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4);
            }
            *(float *)local_68 = local_104;
          }
        }
      }
      break;
    case 0x3ea:
      if ((long)*in_RSI < 0) {
        local_110 = (double)-(long)*in_RSI;
      }
      else {
        local_110 = *in_RSI;
      }
      *local_70 = local_110;
      for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
        for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
          if ((long)in_RSI[local_60 * in_R8 + local_58] < 0) {
            local_118 = (double)-(long)in_RSI[local_60 * in_R8 + local_58];
          }
          else {
            local_118 = in_RSI[local_60 * in_R8 + local_58];
          }
          if ((long)*local_70 < (long)local_118) {
            if ((long)in_RSI[local_60 * in_R8 + local_58] < 0) {
              local_120 = (double)-(long)in_RSI[local_60 * in_R8 + local_58];
            }
            else {
              local_120 = in_RSI[local_60 * in_R8 + local_58];
            }
            *local_70 = local_120;
          }
        }
      }
      break;
    case 0x3eb:
      *(float *)local_80 = *(float *)in_RSI;
      for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
        for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
          if (*(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4) < 0.0) {
            local_124 = -*(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4);
          }
          else {
            local_124 = *(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4);
          }
          if (*(float *)local_80 <= local_124 && local_124 != *(float *)local_80) {
            if (*(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4) < 0.0) {
              local_128 = -*(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4);
            }
            else {
              local_128 = *(float *)((long)in_RSI + (local_60 * in_R8 + local_58) * 4);
            }
            *(float *)local_80 = local_128;
          }
        }
      }
      break;
    case 0x3ec:
      *local_78 = *in_RSI;
      for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
        for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
          if (in_RSI[local_60 * in_R8 + local_58] < 0.0) {
            local_130 = -in_RSI[local_60 * in_R8 + local_58];
          }
          else {
            local_130 = in_RSI[local_60 * in_R8 + local_58];
          }
          if (*local_78 <= local_130 && local_130 != *local_78) {
            if (in_RSI[local_60 * in_R8 + local_58] < 0.0) {
              local_138 = -in_RSI[local_60 * in_R8 + local_58];
            }
            else {
              local_138 = in_RSI[local_60 * in_R8 + local_58];
            }
            *local_78 = local_138;
          }
        }
      }
      break;
    default:
      pnga_error(in_stack_00000070,in_stack_00000068);
      break;
    case 0x3ee:
      local_d8 = SUB84(*in_RSI,0);
      fStack_d4 = (float)((ulong)*in_RSI >> 0x20);
      dVar3 = sqrt((double)(local_d8 * local_d8 + fStack_d4 * fStack_d4));
      *(float *)local_90 = (float)dVar3;
      for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
        for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
          local_d8 = SUB84(in_RSI[local_60 * in_R8 + local_58],0);
          fStack_d4 = (float)((ulong)in_RSI[local_60 * in_R8 + local_58] >> 0x20);
          dVar3 = sqrt((double)(local_d8 * local_d8 + fStack_d4 * fStack_d4));
          fVar2 = (float)dVar3;
          if (*(float *)local_90 <= fVar2 && fVar2 != *(float *)local_90) {
            *(float *)local_90 = fVar2;
          }
        }
      }
      break;
    case 0x3ef:
      dVar3 = sqrt(*in_RSI * *in_RSI + in_RSI[1] * in_RSI[1]);
      *local_88 = dVar3;
      for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
        for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
          dVar3 = in_RSI[(local_60 * in_R8 + local_58) * 2];
          dVar1 = (in_RSI + (local_60 * in_R8 + local_58) * 2)[1];
          dVar3 = sqrt(dVar3 * dVar3 + dVar1 * dVar1);
          if (*local_88 <= dVar3 && dVar3 != *local_88) {
            *local_88 = dVar3;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void sgai_norm_infinity_block(Integer g_a, void *ptr,
                             Integer *lo, Integer *hi, Integer ld,
                             Integer type,
                             Integer ndim, Integer *dims, void *buf)
{
  /*Integer size, nelem, dim2;*/
  Integer iloA=0, ihiA=0, jloA=0, jhiA=0;
  Integer i, j;
  int *isum = NULL;
  long *lsum = NULL;
  double *dsum = NULL;
  float *fsum = NULL;
  DoubleComplex *zsum = NULL;
  SingleComplex *csum = NULL;

  switch (type)
  {
    case C_INT:
      isum = (int *) buf;
      break;
    case C_LONG:
      lsum = (long *) buf;
      break;
    case C_FLOAT:
      fsum = (float *) buf;
      break;
    case C_DBL:
      dsum = (double *) buf;
      break;
    case C_DCPL:
      zsum = (DoubleComplex *) buf;
      break;
    case C_SCPL:
      csum = (SingleComplex *) buf;
      break;
    default:
      pnga_error("ga_norm_infinity_: wrong data type:", type);
  }

  if(ndim<=0)
    pnga_error("ga_norm_infinity: wrong dimension", ndim);
  else if(ndim == 1) {
    iloA=lo[0];
    ihiA=hi[0];
    jloA=1;
    jhiA=1;
  }
  else if(ndim == 2) {
    iloA=lo[0];
    ihiA=hi[0];
    jloA=lo[1];
    jhiA=hi[1];
  }
  else
    pnga_error("ga_norm_infinity: wrong dimension", ndim);

  /* determine subset of my patch to access */
  if (ihiA > 0 && jhiA > 0)
  {
    switch (type)
    {
      int *pi;
      double *pd;
      long *pl;
      float *pf;
      DoubleComplex *pz;
      SingleComplex *pc;
      DoubleComplex zval;
      SingleComplex cval;
      double dtemp;
      float ftemp;
      case C_INT:
      pi = (int *) ptr;
      *isum = GA_ABS(pi[0]);
      for (j = 0; j < jhiA - jloA + 1; j++) {
        for (i = 0; i < ihiA - iloA + 1; i++)
          if (GA_ABS(pi[j*ld + i]) > *isum) *isum = GA_ABS(pi[j*ld+i]);
      } 
      break;
      case C_LONG:
      pl = (long *) ptr;
      *lsum = GA_ABS(pl[0]);
      for (j = 0; j < jhiA - jloA + 1; j++)
        for (i = 0; i < ihiA - iloA + 1; i++)
          if (GA_ABS(pl[j*ld + i]) > *lsum) *lsum = GA_ABS(pl[j*ld+i]);
      break;
      case C_DCPL:
      pz = (DoubleComplex *) ptr;
      zval = pz[0];
      dtemp =
        sqrt (zval.real * zval.real + zval.imag * zval.imag);
      (*zsum).real = dtemp;
      for (j = 0; j < jhiA - jloA + 1; j++)
        for (i = 0; i < ihiA - iloA + 1; i++)
        {
          zval = pz[j * ld + i];
          dtemp =
            sqrt (zval.real * zval.real + zval.imag * zval.imag);
          if (dtemp > (*zsum).real) (*zsum).real = dtemp;
        }
      break;
      case C_SCPL:
      pc = (SingleComplex *) ptr;
      cval =  pc[0];
      ftemp =
        sqrt (cval.real * cval.real + cval.imag * cval.imag);
      (*csum).real = ftemp;
      for (j = 0; j < jhiA - jloA + 1; j++)
        for (i = 0; i < ihiA - iloA + 1; i++)
        {
          cval = pc[j * ld + i];
          ftemp =
            sqrt (cval.real * cval.real + cval.imag * cval.imag);
          if (ftemp > (*csum).real) (*csum).real = ftemp;
        }
      break;
      case C_FLOAT:
      pf = (float *) ptr;
      *fsum = pf[0];
      for (j = 0; j < jhiA - jloA + 1; j++)
        for (i = 0; i < ihiA - iloA + 1; i++)
          if (GA_ABS(pf[j*ld+i]) > *fsum) *fsum = GA_ABS(pf[j*ld+i]);
      break;
      case C_DBL:
      pd = (double *) ptr;
      *dsum = pd[0];
      for (i = 0; i < ihiA - iloA + 1; i++)
        for (j = 0; j < jhiA - jloA + 1; j++)
          if (GA_ABS(pd[j*ld+i]) > *dsum) *dsum = GA_ABS(pd[j*ld+i]);
      break;
      default:
      pnga_error("sgai_norm_infinity_block: wrong data type ", type);
    }
  }
}